

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMessageCompact.h
# Opt level: O3

void __thiscall
nowtech::log::MessageCompact<8ul,true>::
output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
          (MessageCompact<8ul,true> *this,
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *aConverter)

{
  MessageCompact<8ul,true> aFill;
  MessageCompact<8ul,true> *pMVar1;
  MessageCompact<8ul,true> MVar2;
  MessageCompact<8ul,true> *pMVar3;
  unsigned_long aValue;
  long aValue_00;
  longdouble aValue_01;
  
  if (0xe < (byte)this[0xc] - 2) {
    return;
  }
  MVar2 = this[8];
  aFill = this[9];
  switch((uint)(byte)this[0xc]) {
  case 2:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::convert(aConverter,(bool)((byte)*this & 1),(uint8_t)MVar2,(uint8_t)aFill);
    return;
  case 3:
    aValue_01 = (longdouble)*(float *)this;
    MVar2 = (MessageCompact<8ul,true>)0x8;
    goto LAB_0010395a;
  case 4:
    aValue_01 = (longdouble)*(double *)this;
    MVar2 = (MessageCompact<8ul,true>)0x10;
LAB_0010395a:
    if (aFill != (MessageCompact<8ul,true>)0x0) {
      MVar2 = aFill;
    }
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append(aConverter,aValue_01,(uint8_t)MVar2);
    goto LAB_00103997;
  case 5:
    goto switchD_001038de_caseD_5;
  case 6:
    aValue = (unsigned_long)(byte)*this;
    break;
  case 7:
    aValue = (unsigned_long)*(ushort *)this;
    break;
  case 8:
    aValue = (unsigned_long)*(uint *)this;
    break;
  case 9:
    aValue = *(unsigned_long *)this;
    break;
  case 10:
    aValue_00 = (long)(char)*this;
    goto LAB_0010398c;
  case 0xb:
    aValue_00 = (long)*(short *)this;
    goto LAB_0010398c;
  case 0xc:
    aValue_00 = (long)*(int *)this;
    goto LAB_0010398c;
  case 0xd:
    aValue_00 = *(long *)this;
LAB_0010398c:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append<long>(aConverter,aValue_00,(ulong)(byte)MVar2,(uint8_t)aFill);
    goto LAB_00103997;
  case 0xe:
    pMVar1 = (MessageCompact<8ul,true> *)aConverter->mBegin;
    pMVar3 = (MessageCompact<8ul,true> *)aConverter->mEnd;
    if (pMVar1 < pMVar3) {
      *pMVar1 = *this;
      pMVar3 = (MessageCompact<8ul,true> *)aConverter->mEnd;
      pMVar1 = (MessageCompact<8ul,true> *)(aConverter->mBegin + 1);
      aConverter->mBegin = (Iterator)pMVar1;
    }
    if (pMVar3 <= pMVar1) {
      return;
    }
    goto LAB_001039a0;
  case 0xf:
    this = *(MessageCompact<8ul,true> **)this;
  case 0x10:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::convert(aConverter,(char *)this,(uint8_t)MVar2,(uint8_t)aFill);
    return;
  }
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
  ::append<unsigned_long>(aConverter,aValue,(ulong)(byte)MVar2,(uint8_t)aFill);
LAB_00103997:
  pMVar1 = (MessageCompact<8ul,true> *)aConverter->mBegin;
  if (pMVar1 < (MessageCompact<8ul,true> *)aConverter->mEnd) {
LAB_001039a0:
    *pMVar1 = (MessageCompact<8ul,true>)0x20;
    aConverter->mBegin = aConverter->mBegin + 1;
  }
switchD_001038de_caseD_5:
  return;
}

Assistant:

void output(tConverter& aConverter) const noexcept {
    Type type = static_cast<Type>(mData[csOffsetType]);
    uint8_t base = mData[csOffsetBase];
    uint8_t fill = mData[csOffsetFill];

    if(type == Type::cBool) {
      bool value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint8_t) {
      aConverter.convert(mData[csOffsetPayload], base, fill);
    }
    else if(type == Type::cUint16_t) {
      uint16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint32_t) {
      uint32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt8_t) {
      int8_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt16_t) {
      int16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt32_t) {
      int32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cChar) {
      char value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cCharArray) {
      char* value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cStoredChars) {
      aConverter.convert(reinterpret_cast<char const*>(mData + csOffsetPayload), base, fill);
    }
    else {
      if constexpr(csPayloadSize >= sizeof(int64_t) || sizeof(char*) > sizeof(int32_t)) {
        if(type == Type::cUint64_t) {
          uint64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else if(type == Type::cInt64_t) {
          int64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
      if constexpr(tSupportFloatingPoint) {
        if(type == Type::cFloat) {
          float value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
        if constexpr(csPayloadSize >= sizeof(double)) {
          if(type == Type::cDouble) {
            double value;
            std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
            aConverter.convert(value, base, fill);
          }
          else { // nothing to do
          }
          if constexpr(csPayloadSize >= sizeof(long double)) {
            if(type == Type::cLongDouble) {
              long double value;
              std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
              aConverter.convert(value, base, fill);
            }
            else { // nothing to do
            }
          }
          else { // nothing to do
          }
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
    }
  }